

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O0

void IT8951MemBurstReadProc(uint32_t ulMemAddr,uint32_t ulReadSize,uint16_t *pDestBuf)

{
  uint16_t *pDestBuf_local;
  uint32_t ulReadSize_local;
  uint32_t ulMemAddr_local;
  
  IT8951MemBurstReadTrigger(ulMemAddr,ulReadSize);
  IT8951MemBurstReadStart();
  LCDReadNData(pDestBuf,ulReadSize);
  IT8951MemBurstEnd();
  return;
}

Assistant:

void IT8951MemBurstReadProc(uint32_t ulMemAddr , uint32_t ulReadSize, uint16_t* pDestBuf )
{
    //Send Burst Read Start Cmd and Args
    IT8951MemBurstReadTrigger(ulMemAddr , ulReadSize);
          
    //Burst Read Fire
    IT8951MemBurstReadStart();
    
    //Burst Read Request for SPI interface only
    LCDReadNData(pDestBuf, ulReadSize);

    //Send Burst End Cmd
    IT8951MemBurstEnd(); //the same with IT8951MemBurstEnd()
}